

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int __thiscall State::init(State *this,EVP_PKEY_CTX *ctx)

{
  pointer pBVar1;
  int extraout_EAX;
  int iVar2;
  long lVar3;
  float fVar4;
  
  std::vector<Ball,_std::allocator<Ball>_>::resize(&this->balls,(long)(int)ctx);
  iVar2 = extraout_EAX;
  if (0 < (int)ctx) {
    lVar3 = 0;
    do {
      pBVar1 = (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = rand();
      fVar4 = (float)iVar2 * 4.656613e-10 * 0.05 + 0.02;
      *(float *)((long)&pBVar1->r + lVar3) = fVar4;
      *(float *)((long)&pBVar1->m + lVar3) = fVar4 * fVar4 * fVar4;
      iVar2 = rand();
      *(float *)((long)&pBVar1->x + lVar3) =
           (float)iVar2 * 4.656613e-10 + (float)iVar2 * 4.656613e-10 + -1.0;
      iVar2 = rand();
      *(float *)((long)&pBVar1->y + lVar3) =
           (float)iVar2 * 4.656613e-10 + (float)iVar2 * 4.656613e-10 + -1.0;
      iVar2 = rand();
      *(float *)((long)&pBVar1->z + lVar3) =
           (float)iVar2 * 4.656613e-10 + (float)iVar2 * 4.656613e-10 + -1.0;
      iVar2 = rand();
      *(float *)((long)&pBVar1->vx + lVar3) =
           (float)iVar2 * 4.656613e-10 + (float)iVar2 * 4.656613e-10 + -1.0;
      iVar2 = rand();
      *(float *)((long)&pBVar1->vy + lVar3) =
           (float)iVar2 * 4.656613e-10 + (float)iVar2 * 4.656613e-10 + -1.0;
      iVar2 = rand();
      *(float *)((long)&pBVar1->vz + lVar3) =
           (float)iVar2 * 4.656613e-10 + (float)iVar2 * 4.656613e-10 + -1.0;
      lVar3 = lVar3 + 0x20;
    } while (((ulong)ctx & 0xffffffff) << 5 != lVar3);
  }
  return iVar2;
}

Assistant:

void init(int nBalls) {
        balls.resize(nBalls);
        for (int i = 0; i < nBalls; ++i) {
            auto & ball = balls[i];
            ball.r = 0.05f*frand() + 0.02f;
            ball.m = ball.r*ball.r*ball.r;

            ball.x = 2.0f*frand() - 1.0f;
            ball.y = 2.0f*frand() - 1.0f;
            ball.z = 2.0f*frand() - 1.0f;

            ball.vx = 2.0f*frand() - 1.0f;
            ball.vy = 2.0f*frand() - 1.0f;
            ball.vz = 2.0f*frand() - 1.0f;
        }
    }